

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O0

int * __thiscall sisl::cartesian_cubic<int>::operator()(cartesian_cubic<int> *this,int d0,...)

{
  char in_AL;
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list vl;
  uint local_28;
  uint local_24;
  int _z;
  int _y;
  int _x;
  int d0_local;
  cartesian_cubic<int> *this_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  vl[0].overflow_arg_area = local_f8;
  vl[0]._0_8_ = &stack0x00000008;
  local_44 = 0x30;
  local_24 = (uint)local_e8;
  local_48 = 0x20;
  local_28 = (uint)local_e0;
  this->__zero = 0;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  _z = d0;
  _y = d0;
  __x = this;
  bVar1 = in_bound(this,&_z,(int *)&local_24,(int *)&local_28);
  if (bVar1) {
    this_local = (cartesian_cubic<int> *)
                 array_n<int,_3,_std::allocator<int>_>::operator()
                           (&this->_array,_z,(ulong)local_24,(ulong)local_28);
  }
  else {
    this_local = (cartesian_cubic<int> *)&this->__zero;
  }
  return (int *)this_local;
}

Assistant:

virtual T& operator()(int d0, ...) {
            int _x = d0, _y = 0, _z = 0; va_list vl;
            va_start(vl, d0);
            _y = va_arg(vl, int);
            _z = va_arg(vl, int);
            va_end(vl);
            __zero = 0;


            if(!in_bound(_x,_y, _z)) return __zero;
            return _array(_x, _y, _z);
        }